

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_history(CHAR_DATA *ch,char *argument)

{
  char *__src;
  PC_DATA *pPVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  CHAR_DATA *ch_00;
  size_t sVar5;
  ulong uVar6;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  string buffer;
  char obuf [4608];
  char arg2 [4608];
  char arg1 [4608];
  long *local_3878 [2];
  long local_3868 [2];
  char *local_3858 [3];
  buffer<char> local_3840;
  char local_3820 [504];
  char local_3628 [4608];
  uint local_2428;
  short local_2424;
  char local_1228 [4616];
  
  pcVar4 = one_argument(argument,local_1228);
  pcVar4 = one_argument(pcVar4,(char *)&local_2428);
  if (local_1228[0] == '\0') {
    send_to_char("Syntax: history <character>          = read a character\'s history\n\r",ch);
    send_to_char("        history <character> + <info> = add to the temporary buffer\n\r",ch);
    send_to_char("        history <character> -        = remove the last line from the temporary buffer\n\r"
                 ,ch);
    send_to_char("        history <character> show     = shows the temporary buffer\n\r",ch);
    send_to_char("        history <character> add      = write the temporary buffer to their pfile\n\r"
                 ,ch);
    pcVar4 = "        history <character> clear    = clear a player\'s history (IMP ONLY)\n\r";
  }
  else {
    ch_00 = get_char_world(ch,local_1228);
    if (ch_00 == (CHAR_DATA *)0x0) {
      send_to_char("They aren\'t here, attempting offline history...\n\r",ch);
      local_3840.size_ = 0;
      local_3840._vptr_buffer = (_func_int **)&PTR_grow_0044b3a0;
      local_3840.capacity_ = 500;
      fmt.size_ = 0x11;
      fmt.data_ = "finger {} history";
      args.field_1.values_ =
           (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_3858;
      args.desc_ = 0xc;
      local_3858[0] = local_1228;
      local_3840.ptr_ = local_3820;
      ::fmt::v9::detail::vformat_to<char>(&local_3840,fmt,args,(locale_ref)0x0);
      local_3878[0] = local_3868;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3878,local_3840.ptr_,local_3840.ptr_ + local_3840.size_);
      if (local_3840.ptr_ != local_3820) {
        operator_delete(local_3840.ptr_,local_3840.capacity_);
      }
      interpret(ch,(char *)local_3878[0]);
      if (local_3878[0] == local_3868) {
        return;
      }
      operator_delete(local_3878[0],local_3868[0] + 1);
      return;
    }
    bVar2 = is_npc(ch_00);
    if (bVar2) {
      pcVar4 = "You can\'t history a mob.\n\r";
    }
    else {
      if ((ch_00->level < ch->level) || (iVar3 = get_trust(ch), 0x3b < iVar3)) {
        if ((char)local_2428 != '\0') {
          if (local_2424 == 0x72 && local_2428 == 0x61656c63) {
            bVar2 = IS_IMP(ch);
            if (!bVar2) {
              pcVar4 = "You are not permitted to complete that operation.\n\r";
              goto LAB_00270aa4;
            }
            ch_00->pcdata->history_buffer = (char *)0x0;
          }
          if (local_2428 != 0x646461) {
            if ((char)local_2424 != '\0' || local_2428 != 0x776f6873) {
              if ((short)local_2428 == 0x2b) {
                if (*pcVar4 == '\0') {
                  pcVar4 = "Add what?\n\r";
                  goto LAB_00270aa4;
                }
                local_3628[0] = '\0';
                __src = ch_00->pcdata->temp_history_buffer;
                if (__src != (char *)0x0) {
                  strcat(local_3628,__src);
                }
                smash_tilde(pcVar4);
                strcat(local_3628,pcVar4);
                sVar5 = strlen(local_3628);
                (local_3628 + sVar5)[0] = '\n';
                (local_3628 + sVar5)[1] = '\r';
                local_3628[sVar5 + 2] = '\0';
                free_pstring(ch_00->pcdata->temp_history_buffer);
                pcVar4 = palloc_string(local_3628);
                ch_00->pcdata->temp_history_buffer = pcVar4;
                show_temp_history(ch,ch_00);
                local_2428 = local_2428 & 0xffff;
              }
              if ((short)local_2428 != 0x2d) {
                return;
              }
              pPVar1 = ch_00->pcdata;
              pcVar4 = pPVar1->temp_history_buffer;
              if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
                pcVar4 = "No lines left to remove.\n\r";
                goto LAB_00270aa4;
              }
              strcpy(local_3628,pcVar4);
              uVar6 = strlen(local_3628);
              if (0 < (int)uVar6) {
                bVar2 = false;
                do {
                  iVar3 = (int)uVar6;
                  if (local_3628[uVar6 & 0xffffffff] == '\r') {
                    if (bVar2) {
                      local_3628[(uVar6 & 0xffffffff) + 1] = '\0';
                      goto LAB_00270dc5;
                    }
                    iVar3 = iVar3 + -1;
                    bVar2 = true;
                  }
                  uVar6 = (ulong)(iVar3 - 1);
                } while (1 < iVar3);
              }
              local_3628[0] = '\0';
LAB_00270dc5:
              free_pstring(pPVar1->temp_history_buffer);
              pcVar4 = palloc_string(local_3628);
              ch_00->pcdata->temp_history_buffer = pcVar4;
            }
            show_temp_history(ch,ch_00);
            return;
          }
          pcVar4 = ch_00->pcdata->temp_history_buffer;
          if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
            pcVar4 = "The temporary buffer for that character is empty.\n\r";
            goto LAB_00270aa4;
          }
          add_history(ch,ch_00,pcVar4);
          free_pstring(ch_00->pcdata->temp_history_buffer);
          ch_00->pcdata->temp_history_buffer = (char *)0x0;
        }
        show_history(ch,ch_00);
        return;
      }
      pcVar4 = "Access denied.\n\r";
    }
  }
LAB_00270aa4:
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void do_history(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg1[MAX_STRING_LENGTH];
	char arg2[MAX_STRING_LENGTH];
	char obuf[MAX_STRING_LENGTH];
	CHAR_DATA *victim;
	int len;
	bool found = false;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (arg1[0] == '\0')
	{
		send_to_char("Syntax: history <character>          = read a character's history\n\r", ch);
		send_to_char("        history <character> + <info> = add to the temporary buffer\n\r", ch);
		send_to_char("        history <character> -        = remove the last line from the temporary buffer\n\r", ch);
		send_to_char("        history <character> show     = shows the temporary buffer\n\r", ch);
		send_to_char("        history <character> add      = write the temporary buffer to their pfile\n\r", ch);
		send_to_char("        history <character> clear    = clear a player's history (IMP ONLY)\n\r", ch);
		return;
	}

	victim = get_char_world(ch,arg1);

	if (victim == nullptr)
	{
		send_to_char("They aren't here, attempting offline history...\n\r", ch);
		auto buffer = fmt::format("finger {} history", arg1);
		interpret(ch, buffer.data());
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("You can't history a mob.\n\r", ch);
		return;
	}

	if (victim->level >= ch->level && get_trust(ch) < 60)
	{
		send_to_char("Access denied.\n\r", ch);
		return;
	}

	if (arg2[0] == '\0')
	{
		show_history(ch, victim);
		return;
	}

	if (!strcmp(arg2, "clear"))
	{
		if (!IS_IMP(ch))
		{
			send_to_char("You are not permitted to complete that operation.\n\r", ch);
			return;
		}

		victim->pcdata->history_buffer = nullptr;
	}

	if (!strcmp(arg2, "add"))
	{
		if (victim->pcdata->temp_history_buffer == nullptr || victim->pcdata->temp_history_buffer[0] == '\0')
		{
			send_to_char("The temporary buffer for that character is empty.\n\r", ch);
			return;
		}
		else
		{
			add_history(ch, victim, victim->pcdata->temp_history_buffer);

			free_pstring(victim->pcdata->temp_history_buffer);
			victim->pcdata->temp_history_buffer = nullptr;

			show_history(ch, victim);
		}

		return;
	}

	if (!strcmp(arg2, "show"))
	{
		show_temp_history(ch, victim);
		return;
	}

	if (!strcmp(arg2, "+"))
	{
		if (argument[0] != '\0')
		{
			obuf[0] = '\0';
			if (victim->pcdata->temp_history_buffer)
			{
				strcat(obuf, victim->pcdata->temp_history_buffer);
			}
			smash_tilde(argument);
			strcat(obuf, argument);
			strcat(obuf, "\n\r");

			free_pstring(victim->pcdata->temp_history_buffer);
			victim->pcdata->temp_history_buffer = palloc_string(obuf);
		}
		else
		{
			send_to_char("Add what?\n\r", ch);
			return;
		}

		show_temp_history(ch, victim);
	}

	if (!strcmp(arg2, "-"))
	{

		if (victim->pcdata->temp_history_buffer == nullptr || victim->pcdata->temp_history_buffer[0] == '\0')
		{
			send_to_char("No lines left to remove.\n\r", ch);
			return;
		}

		strcpy(obuf, victim->pcdata->temp_history_buffer);

		for (len = strlen(obuf); len > 0; len--)
		{
			if (obuf[len] == '\r')
			{
				if (!found)
				{
					if (len > 0)
					{
						len--;
					}
					found = true;
				}
				else
				{
					obuf[len + 1] = '\0';
					free_pstring(victim->pcdata->temp_history_buffer);
					victim->pcdata->temp_history_buffer = palloc_string(obuf);
					show_temp_history(ch, victim);
					return;
				}
			}
		}

		obuf[0] = '\0';

		free_pstring(victim->pcdata->temp_history_buffer);
		victim->pcdata->temp_history_buffer = palloc_string(obuf);

		show_temp_history(ch, victim);
	}
}